

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_flip_h(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
              JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
              jvirt_barray_ptr *dst_coef_arrays)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  JBLOCKROW output_row;
  long lVar8;
  long lVar9;
  int in_ECX;
  short *psVar10;
  int in_EDX;
  JCOEF *pJVar11;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  jpeg_component_info *compptr;
  JCOEFPTR dst_ptr;
  JCOEFPTR src_ptr;
  JBLOCKROW dst_row_ptr;
  JBLOCKROW src_row_ptr;
  JBLOCKARRAY dst_buffer;
  JBLOCKARRAY src_buffer;
  int offset_y;
  int k;
  int ci;
  JDIMENSION y_crop_blocks;
  JDIMENSION x_crop_blocks;
  JDIMENSION dst_blk_y;
  JDIMENSION dst_blk_x;
  JDIMENSION comp_width;
  JDIMENSION MCU_cols;
  JCOEF *in_stack_ffffffffffffff80;
  JCOEF *local_78;
  int local_4c;
  int local_48;
  int local_44;
  uint local_38;
  uint local_34;
  
  uVar1 = *(uint *)(in_RDI + 0x88);
  iVar2 = *(int *)(in_RSI + 0x138);
  for (local_44 = 0; local_44 < *(int *)(in_RSI + 0x4c); local_44 = local_44 + 1) {
    output_row = (JBLOCKROW)(*(long *)(in_RSI + 0x58) + (long)local_44 * 0x60);
    uVar6 = (uVar1 / (uint)(iVar2 << 3)) * *(int *)(*output_row + 4);
    iVar7 = in_EDX * *(int *)(*output_row + 4);
    iVar3 = *(int *)(*output_row + 6);
    for (local_38 = 0; local_38 < *(uint *)(*output_row + 0x10);
        local_38 = *(int *)(*output_row + 6) + local_38) {
      lVar8 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_R9 + (long)local_44 * 8),local_38,
                         *(undefined4 *)(*output_row + 6),1);
      lVar9 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_R8 + (long)local_44 * 8),
                         local_38 + in_ECX * iVar3,*(undefined4 *)(*output_row + 6),0);
      for (local_4c = 0; local_4c < *(int *)(*output_row + 6); local_4c = local_4c + 1) {
        lVar4 = *(long *)(lVar8 + (long)local_4c * 8);
        lVar5 = *(long *)(lVar9 + (long)local_4c * 8);
        for (local_34 = 0; local_34 < *(uint *)(*output_row + 0xe); local_34 = local_34 + 1) {
          if (iVar7 + local_34 < uVar6) {
            in_stack_ffffffffffffff80 = (JCOEF *)(lVar4 + (ulong)local_34 * 0x80);
            local_78 = (JCOEF *)(lVar5 + (ulong)(((uVar6 - iVar7) - local_34) - 1) * 0x80);
            for (local_48 = 0; local_48 < 0x40; local_48 = local_48 + 2) {
              psVar10 = local_78 + 1;
              pJVar11 = in_stack_ffffffffffffff80 + 1;
              *in_stack_ffffffffffffff80 = *local_78;
              local_78 = local_78 + 2;
              in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 2;
              *pJVar11 = -*psVar10;
            }
          }
          else {
            jcopy_block_row((JBLOCKROW)in_stack_ffffffffffffff80,output_row,0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
do_flip_h(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
          JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
          jvirt_barray_ptr *src_coef_arrays,
          jvirt_barray_ptr *dst_coef_arrays)
/* Horizontal flip in general cropping case */
{
  JDIMENSION MCU_cols, comp_width, dst_blk_x, dst_blk_y;
  JDIMENSION x_crop_blocks, y_crop_blocks;
  int ci, k, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  JBLOCKROW src_row_ptr, dst_row_ptr;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  /* Here we must output into a separate array because we can't touch
   * different rows of a single virtual array simultaneously.  Otherwise,
   * this is essentially the same as the routine above.
   */
  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      src_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], dst_blk_y + y_crop_blocks,
         (JDIMENSION)compptr->v_samp_factor, FALSE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        dst_row_ptr = dst_buffer[offset_y];
        src_row_ptr = src_buffer[offset_y];
        for (dst_blk_x = 0; dst_blk_x < compptr->width_in_blocks;
             dst_blk_x++) {
          if (x_crop_blocks + dst_blk_x < comp_width) {
            /* Do the mirrorable blocks */
            dst_ptr = dst_row_ptr[dst_blk_x];
            src_ptr = src_row_ptr[comp_width - x_crop_blocks - dst_blk_x - 1];
            /* this unrolled loop doesn't need to know which row it's on... */
            for (k = 0; k < DCTSIZE2; k += 2) {
              *dst_ptr++ = *src_ptr++;    /* copy even column */
              *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign
                                             change */
            }
          } else {
            /* Copy last partial block(s) verbatim */
            jcopy_block_row(src_row_ptr + dst_blk_x + x_crop_blocks,
                            dst_row_ptr + dst_blk_x, (JDIMENSION)1);
          }
        }
      }
    }
  }
}